

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qstackedwidget.cpp
# Opt level: O1

int __thiscall QStackedWidget::qt_metacall(QStackedWidget *this,Call _c,int _id,void **_a)

{
  int _id_00;
  undefined8 *puVar1;
  QStackedWidget *_t;
  
  _id_00 = QFrame::qt_metacall(&this->super_QFrame,_c,_id,_a);
  if (_id_00 < 0) {
    return _id_00;
  }
  if (_c == InvokeMetaMethod) {
    if (_id_00 < 5) {
      qt_static_metacall((QObject *)this,InvokeMetaMethod,_id_00,_a);
    }
    _id_00 = _id_00 + -5;
  }
  if (_c != RegisterMethodArgumentMetaType) goto LAB_0048f1f4;
  if (_id_00 < 5) {
    if (_id_00 == 4) {
      puVar1 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        *puVar1 = &QtPrivate::QMetaTypeInterfaceWrapper<QWidget_*>::metaType;
        goto LAB_0048f1f1;
      }
    }
    else {
      puVar1 = (undefined8 *)*_a;
    }
    *puVar1 = 0;
  }
LAB_0048f1f1:
  _id_00 = _id_00 + -5;
LAB_0048f1f4:
  if ((_c < CustomCall) && ((0x14eU >> (_c & 0x1f) & 1) != 0)) {
    qt_static_metacall((QObject *)this,_c,_id_00,_a);
    _id_00 = _id_00 + -2;
  }
  return _id_00;
}

Assistant:

int QStackedWidget::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QFrame::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 5)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 5;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 5)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 5;
    }
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 2;
    }
    return _id;
}